

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase222::run(TestCase222 *this)

{
  unsigned_short *puVar1;
  anon_union_40_2_42f82436 *paVar2;
  ArrayPtr<unsigned_char> AVar3;
  Arena arena;
  unsigned_short *local_48;
  unsigned_short *local_40;
  anon_union_40_2_42f82436 anon_var_0;
  
  AVar3.size_ = 0x22;
  AVar3.ptr = (uchar *)&anon_var_0;
  Arena::Arena(&arena,AVar3);
  AVar3 = Arena::allocateArray<unsigned_char>(&arena,0);
  Arena::allocateArray<unsigned_char>(&arena,(long)&anon_var_0 + (0x18 - (long)AVar3.ptr));
  puVar1 = Arena::allocate<unsigned_short>(&arena);
  if (((unsigned_short *)(anon_var_0.scratch + 0x18) != puVar1) && (_::Debug::minSeverity < 3)) {
    local_48 = puVar1;
    local_40 = (unsigned_short *)(anon_var_0.scratch + 0x18);
    _::Debug::log<char_const(&)[65],unsigned_char*,unsigned_char*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xee,ERROR,
               "\"failed: expected \" \"(scratch + 24) == (reinterpret_cast<byte*>(&i))\", scratch + 24, reinterpret_cast<byte*>(&i)"
               ,(char (*) [65])"failed: expected (scratch + 24) == (reinterpret_cast<byte*>(&i))",
               (uchar **)&local_40,(uchar **)&local_48);
  }
  paVar2 = (anon_union_40_2_42f82436 *)Arena::allocate<unsigned_long>(&arena);
  if (((&anon_var_0 <= paVar2) &&
      (paVar2 <= (anon_union_40_2_42f82436 *)(anon_var_0.scratch + 0x22))) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[116]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xf4,ERROR,
               "\"failed: expected \" \"reinterpret_cast<byte*>(&i2) < scratch || reinterpret_cast<byte*>(&i2) > scratch + sizeof(scratch)\""
               ,(char (*) [116])
                "failed: expected reinterpret_cast<byte*>(&i2) < scratch || reinterpret_cast<byte*>(&i2) > scratch + sizeof(scratch)"
              );
  }
  Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, EndOfChunkAlignment) {
  union {
    byte scratch[34];
    uint64_t align;
  };
  Arena arena(arrayPtr(scratch, sizeof(scratch)));

  // Figure out where we are...
  byte* start = arena.allocateArray<byte>(0).begin();

  // Allocate enough space so that we're 24 bytes into the scratch space.  (On 64-bit systems, this
  // should be zero.)
  arena.allocateArray<byte>(24 - (start - scratch));

  // Allocating a 16-bit integer works.  Now we're at 26 bytes; 8 bytes are left.
  uint16_t& i = arena.allocate<uint16_t>();
  EXPECT_EQ(scratch + 24, reinterpret_cast<byte*>(&i));

  // Although there is technically enough space to allocate a uint64, it is not aligned correctly,
  // so it will be allocated elsewhere instead.
  uint64_t& i2 = arena.allocate<uint64_t>();
  EXPECT_TRUE(reinterpret_cast<byte*>(&i2) < scratch ||
              reinterpret_cast<byte*>(&i2) > scratch + sizeof(scratch));
}